

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O1

void __thiscall logUnits_base10_Test::~logUnits_base10_Test(logUnits_base10_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(logUnits, base10)
{
    EXPECT_EQ(convert(precise::ten, precise::log::bel), 2.0);
    EXPECT_EQ(convert(precise::kilo, precise::log::bel), 6.0);
    EXPECT_EQ(convert(precise::milli, precise::log::bel), -6.0);
    EXPECT_EQ(convert(precise::exa, precise::log::bel), 36.0);
    EXPECT_EQ(convert(precise::femto, precise::log::bel), -30.0);
    EXPECT_EQ(convert(2.0, precise::log::bel, precise::ten), 1.0);
    EXPECT_EQ(convert(6.0, precise::log::bel, precise::kilo), 1.0);
    EXPECT_DOUBLE_EQ(convert(-6.0, precise::log::bel, precise::milli), 1.0);
    EXPECT_DOUBLE_EQ(convert(-6.0, precise::log::belA, precise::milli), 1.0);
    EXPECT_DOUBLE_EQ(convert(-3.0, precise::log::belP, precise::milli), 1.0);
    EXPECT_DOUBLE_EQ(convert(36.0, precise::log::bel, precise::exa), 1.0);
    EXPECT_NEAR(
        convert(-30.0, precise::log::bel, precise::femto),
        1.0,
        test::precise_tolerance);

    EXPECT_EQ(convert(precise::ten, precise::log::belP), 1.0);
    EXPECT_EQ(convert(precise::ten, precise::log::belA), 2.0);
    EXPECT_EQ(convert(precise::kilo, precise::log::belP), 3.0);
    EXPECT_EQ(convert(precise::milli, precise::log::belP), -3.0);
    EXPECT_EQ(convert(precise::exa, precise::log::belP), 18.0);
    EXPECT_EQ(convert(precise::femto, precise::log::belP), -15.0);
    EXPECT_EQ(convert(1.0, precise::log::belP, precise::ten), 1.0);
    EXPECT_EQ(convert(3.0, precise::log::belP, precise::kilo), 1.0);
    EXPECT_DOUBLE_EQ(convert(-3.0, precise::log::belP, precise::milli), 1.0);
    EXPECT_DOUBLE_EQ(convert(18.0, precise::log::belP, precise::exa), 1.0);
    EXPECT_NEAR(
        convert(-15.0, precise::log::belP, precise::femto),
        1.0,
        test::precise_tolerance);
}